

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-math.h
# Opt level: O0

shared_ptr<RoomBase> RoomMath::getMathAddBR(element_type *param_1)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TTimestamp TVar2;
  double dVar3;
  shared_ptr<RoomBase> sVar4;
  shared_ptr<RoomMath> result;
  shared_ptr<RoomMath> *in_stack_ffffffffffffff98;
  shared_ptr<RoomBase> *this;
  element_type *this_00;
  
  this_00 = param_1;
  std::make_shared<RoomMath>();
  peVar1 = std::__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x114fff);
  (peVar1->super_RoomBase).mode = BattleRoyale;
  peVar1 = std::__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x115010);
  std::__cxx11::string::operator=((string *)&(peVar1->super_RoomBase).name,"Math [+,BR]");
  peVar1 = std::__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11502f);
  (peVar1->super_RoomBase).poolSize = 0x1e;
  TVar2 = anon_unknown.dwarf_1322b::timestamp_s();
  peVar1 = std::__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11504d);
  (peVar1->super_RoomBase).tCreated_s = TVar2;
  peVar1 = std::__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x115062);
  (peVar1->super_RoomBase).tRoundLength_s = 15.0;
  peVar1 = std::__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x115079);
  (peVar1->super_RoomBase).tBRRoundLength_s = 15.0;
  peVar1 = std::__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x115090);
  this = (shared_ptr<RoomBase> *)(peVar1->super_RoomBase).tCreated_s;
  peVar1 = std::__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1150a5);
  dVar3 = (double)this - (peVar1->super_RoomBase).tRoundLength_s;
  peVar1 = std::__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1150c0);
  (peVar1->super_RoomBase).tRoundStart_s = dVar3;
  std::__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<RoomMath,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1150d5);
  std::function<std::pair<std::__cxx11::string,std::__cxx11::string>(int,int)>::operator=
            ((function<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(int,_int)>
              *)this_00,(anon_class_1_0_00000001 *)param_1);
  std::shared_ptr<RoomBase>::shared_ptr<RoomMath,void>(this,in_stack_ffffffffffffff98);
  std::shared_ptr<RoomMath>::~shared_ptr((shared_ptr<RoomMath> *)0x115102);
  sVar4.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<RoomBase>)sVar4.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<RoomBase> getMathAddBR(Parameters parameters) {
        auto result = std::make_shared<RoomMath>();

        result->mode = BattleRoyale;
        result->name = "Math [+,BR]";
        result->poolSize = 30;
        result->tCreated_s = timestamp_s();
        result->tRoundLength_s = 0.25f*60.f;
        result->tBRRoundLength_s = 0.25f*60.f;
        result->tRoundStart_s = result->tCreated_s - result->tRoundLength_s;

        result->getQuery = [](int a, int b) -> std::pair<std::string, std::string> {
            return {
                std::to_string(a) + "+" + std::to_string(b),
                std::to_string(a+b),
            };
        };

        return result;
    }